

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContactTriangleXYZROT::LoadableGetStateBlock_w(ChContactTriangleXYZROT *this)

{
  ChStateDelta *in_RDX;
  int in_ESI;
  
  LoadableGetStateBlock_w
            ((ChContactTriangleXYZROT *)
             ((long)&(this->super_ChContactable_3vars<6,_6,_6>).super_ChContactable.
                     _vptr_ChContactable +
             (long)(this->super_ChContactable_3vars<6,_6,_6>).super_ChContactable.
                   _vptr_ChContactable[-7]),in_ESI,in_RDX);
  return;
}

Assistant:

void ChContactTriangleXYZROT::LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) {
    mD.segment(block_offset + 0, 3) = mnode1->GetPos_dt().eigen();
    mD.segment(block_offset + 3, 3) = mnode1->GetWvel_loc().eigen();

    mD.segment(block_offset + 6, 3) = mnode2->GetPos_dt().eigen();
    mD.segment(block_offset + 9, 3) = mnode2->GetWvel_loc().eigen();

    mD.segment(block_offset + 12, 3) = mnode3->GetPos_dt().eigen();
    mD.segment(block_offset + 15, 3) = mnode3->GetWvel_loc().eigen();
}